

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,LinearSpace3fa *space,
          size_t primID,BBox1f *time_range)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar17;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar18;
  ulong uVar19;
  size_t *psVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  float fVar64;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar73;
  float fVar74;
  undefined1 auVar72 [16];
  float fVar75;
  undefined1 auVar76 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  
  fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar33 = (this->super_LineSegments).super_Geometry.time_range.lower;
  fVar53 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar33;
  fVar30 = (time_range->lower - fVar33) / fVar53;
  fVar53 = (time_range->upper - fVar33) / fVar53;
  fVar33 = fVar1 * fVar30;
  fVar34 = fVar53 * fVar1;
  auVar43 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),9);
  auVar40 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),10);
  auVar31 = vmaxss_avx(auVar43,ZEXT816(0));
  auVar39 = vminss_avx(auVar40,ZEXT416((uint)fVar1));
  fVar35 = auVar31._0_4_;
  fVar36 = auVar39._0_4_;
  iVar21 = -1;
  if (-1 < (int)auVar43._0_4_) {
    iVar21 = (int)auVar43._0_4_;
  }
  uVar10 = (int)fVar1 + 1U;
  if ((int)auVar40._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar10 = (int)auVar40._0_4_;
  }
  lVar23 = (long)(int)fVar35;
  uVar22 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                    primID * *(long *)&(this->super_LineSegments).field_0x68);
  uVar19 = (ulong)uVar22;
  pBVar7 = (this->super_LineSegments).vertices.items;
  pcVar8 = pBVar7[lVar23].super_RawBufferView.ptr_ofs;
  sVar9 = pBVar7[lVar23].super_RawBufferView.stride;
  lVar25 = sVar9 * uVar19;
  uVar24 = (ulong)(uVar22 + 1);
  lVar27 = sVar9 * uVar24;
  fVar2 = *(float *)(pcVar8 + lVar25);
  fVar46 = *(float *)(pcVar8 + lVar25 + 4);
  fVar49 = *(float *)(pcVar8 + lVar25 + 8);
  fVar11 = (space->vx).field_0.m128[0];
  fVar12 = (space->vx).field_0.m128[1];
  fVar13 = (space->vx).field_0.m128[2];
  fVar14 = (space->vx).field_0.m128[3];
  fVar52 = (space->vy).field_0.m128[0];
  fVar56 = (space->vy).field_0.m128[1];
  fVar59 = (space->vy).field_0.m128[2];
  aVar18 = (space->vy).field_0.field_1;
  fVar15 = (space->vy).field_0.m128[3];
  fVar60 = (space->vz).field_0.m128[0];
  fVar61 = (space->vz).field_0.m128[1];
  fVar62 = (space->vz).field_0.m128[2];
  aVar17 = (space->vz).field_0.field_1;
  fVar16 = (space->vz).field_0.m128[3];
  auVar31._0_4_ = fVar2 * fVar11 + fVar49 * fVar60 + fVar46 * fVar52;
  auVar31._4_4_ = fVar2 * fVar12 + fVar49 * fVar61 + fVar46 * fVar56;
  auVar31._8_4_ = fVar2 * fVar13 + fVar49 * fVar62 + fVar46 * fVar59;
  auVar31._12_4_ = fVar2 * fVar14 + fVar49 * fVar16 + fVar46 * fVar15;
  uVar3 = *(undefined4 *)(pcVar8 + lVar25 + 0xc);
  auVar40._4_4_ = uVar3;
  auVar40._0_4_ = uVar3;
  auVar40._8_4_ = uVar3;
  auVar40._12_4_ = uVar3;
  auVar31 = vblendps_avx(auVar31,auVar40,8);
  fVar2 = *(float *)(pcVar8 + lVar27);
  fVar46 = *(float *)(pcVar8 + lVar27 + 4);
  fVar49 = *(float *)(pcVar8 + lVar27 + 8);
  auVar43._0_4_ = fVar49 * fVar60 + fVar46 * fVar52 + fVar2 * fVar11;
  auVar43._4_4_ = fVar49 * fVar61 + fVar46 * fVar56 + fVar2 * fVar12;
  auVar43._8_4_ = fVar49 * fVar62 + fVar46 * fVar59 + fVar2 * fVar13;
  auVar43._12_4_ = fVar49 * fVar16 + fVar46 * fVar15 + fVar2 * fVar14;
  uVar3 = *(undefined4 *)(pcVar8 + lVar27 + 0xc);
  auVar47._4_4_ = uVar3;
  auVar47._0_4_ = uVar3;
  auVar47._8_4_ = uVar3;
  auVar47._12_4_ = uVar3;
  auVar39 = vblendps_avx(auVar43,auVar47,8);
  auVar43 = vminps_avx(auVar31,auVar39);
  auVar31 = vmaxps_avx(auVar31,auVar39);
  fVar2 = (this->super_LineSegments).maxRadiusScale;
  auVar39 = vmaxss_avx(auVar47,auVar40);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ * fVar2));
  auVar39 = vshufps_avx(auVar39,auVar39,0);
  auVar40 = vsubps_avx(auVar43,auVar39);
  fVar64 = auVar31._0_4_ + auVar39._0_4_;
  fVar67 = auVar31._4_4_ + auVar39._4_4_;
  fVar68 = auVar31._8_4_ + auVar39._8_4_;
  fVar69 = auVar31._12_4_ + auVar39._12_4_;
  lVar25 = (long)(int)fVar36;
  pcVar8 = pBVar7[lVar25].super_RawBufferView.ptr_ofs;
  sVar9 = pBVar7[lVar25].super_RawBufferView.stride;
  lVar26 = sVar9 * uVar19;
  lVar27 = sVar9 * uVar24;
  fVar46 = *(float *)(pcVar8 + lVar26 + 4);
  fVar49 = *(float *)(pcVar8 + lVar26 + 8);
  fVar50 = *(float *)(pcVar8 + lVar26);
  auVar39._0_4_ = fVar11 * fVar50 + fVar60 * fVar49 + fVar52 * fVar46;
  auVar39._4_4_ = fVar12 * fVar50 + fVar61 * fVar49 + fVar56 * fVar46;
  auVar39._8_4_ = fVar13 * fVar50 + fVar62 * fVar49 + fVar59 * fVar46;
  auVar39._12_4_ = fVar14 * fVar50 + fVar16 * fVar49 + fVar15 * fVar46;
  fVar46 = *(float *)(pcVar8 + lVar27 + 8);
  fVar49 = *(float *)(pcVar8 + lVar27 + 4);
  fVar50 = *(float *)(pcVar8 + lVar27);
  auVar44._0_4_ = fVar50 * fVar11 + fVar49 * fVar52 + fVar60 * fVar46;
  auVar44._4_4_ = fVar50 * fVar12 + fVar49 * fVar56 + fVar61 * fVar46;
  auVar44._8_4_ = fVar50 * fVar13 + fVar49 * fVar59 + fVar62 * fVar46;
  auVar44._12_4_ = fVar50 * fVar14 + fVar49 * fVar15 + fVar16 * fVar46;
  uVar3 = *(undefined4 *)(pcVar8 + lVar26 + 0xc);
  auVar48._4_4_ = uVar3;
  auVar48._0_4_ = uVar3;
  auVar48._8_4_ = uVar3;
  auVar48._12_4_ = uVar3;
  auVar31 = vblendps_avx(auVar39,auVar48,8);
  uVar3 = *(undefined4 *)(pcVar8 + lVar27 + 0xc);
  auVar72._4_4_ = uVar3;
  auVar72._0_4_ = uVar3;
  auVar72._8_4_ = uVar3;
  auVar72._12_4_ = uVar3;
  auVar39 = vblendps_avx(auVar44,auVar72,8);
  auVar43 = vminps_avx(auVar31,auVar39);
  auVar31 = vmaxps_avx(auVar31,auVar39);
  auVar39 = vmaxss_avx(auVar72,auVar48);
  auVar39 = ZEXT416((uint)(fVar2 * auVar39._0_4_));
  auVar39 = vshufps_avx(auVar39,auVar39,0);
  auVar43 = vsubps_avx(auVar43,auVar39);
  fVar46 = auVar31._0_4_ + auVar39._0_4_;
  fVar49 = auVar31._4_4_ + auVar39._4_4_;
  fVar50 = auVar31._8_4_ + auVar39._8_4_;
  fVar51 = auVar31._12_4_ + auVar39._12_4_;
  local_68 = auVar40._0_4_;
  fStack_64 = auVar40._4_4_;
  fStack_60 = auVar40._8_4_;
  fStack_5c = auVar40._12_4_;
  fVar71 = auVar43._0_4_;
  fVar73 = auVar43._4_4_;
  fVar74 = auVar43._8_4_;
  fVar75 = auVar43._12_4_;
  if (uVar10 - iVar21 == 1) {
    auVar37._0_12_ = ZEXT812(0);
    auVar37._12_4_ = 0;
    auVar31 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar35)),auVar37);
    auVar39 = vshufps_avx(auVar31,auVar31,0);
    auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         auVar31._0_4_ * local_68 + fVar71 * auVar39._0_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         auVar31._4_4_ * fStack_64 + fVar73 * auVar39._4_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         auVar31._8_4_ * fStack_60 + fVar74 * auVar39._8_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         auVar31._12_4_ * fStack_5c + fVar75 * auVar39._12_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
         fVar64 * auVar31._0_4_ + fVar46 * auVar39._0_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
         fVar67 * auVar31._4_4_ + fVar49 * auVar39._4_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
         fVar68 * auVar31._8_4_ + fVar50 * auVar39._8_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
         fVar69 * auVar31._12_4_ + fVar51 * auVar39._12_4_;
    auVar31 = vmaxss_avx(ZEXT416((uint)(fVar36 - fVar34)),auVar37);
    auVar39 = vshufps_avx(auVar31,auVar31,0);
    auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    fVar33 = auVar39._0_4_ * local_68 + fVar71 * auVar31._0_4_;
    fVar34 = auVar39._4_4_ * fStack_64 + fVar73 * auVar31._4_4_;
    fVar35 = auVar39._8_4_ * fStack_60 + fVar74 * auVar31._8_4_;
    fVar36 = auVar39._12_4_ * fStack_5c + fVar75 * auVar31._12_4_;
    fVar46 = fVar64 * auVar39._0_4_ + fVar46 * auVar31._0_4_;
    fVar49 = fVar67 * auVar39._4_4_ + fVar49 * auVar31._4_4_;
    fVar50 = fVar68 * auVar39._8_4_ + fVar50 * auVar31._8_4_;
    fVar52 = fVar69 * auVar39._12_4_ + fVar51 * auVar31._12_4_;
  }
  else {
    pcVar8 = pBVar7[lVar23 + 1].super_RawBufferView.ptr_ofs;
    sVar9 = pBVar7[lVar23 + 1].super_RawBufferView.stride;
    lVar27 = sVar9 * uVar19;
    lVar23 = sVar9 * uVar24;
    fVar4 = *(float *)(pcVar8 + lVar27);
    fVar5 = *(float *)(pcVar8 + lVar27 + 4);
    fVar6 = *(float *)(pcVar8 + lVar27 + 8);
    auVar41._0_4_ = fVar11 * fVar4 + fVar6 * fVar60 + fVar52 * fVar5;
    auVar41._4_4_ = fVar12 * fVar4 + fVar6 * fVar61 + fVar56 * fVar5;
    auVar41._8_4_ = fVar13 * fVar4 + fVar6 * fVar62 + fVar59 * fVar5;
    auVar41._12_4_ = fVar14 * fVar4 + fVar6 * fVar16 + fVar15 * fVar5;
    uVar3 = *(undefined4 *)(pcVar8 + lVar27 + 0xc);
    auVar45._4_4_ = uVar3;
    auVar45._0_4_ = uVar3;
    auVar45._8_4_ = uVar3;
    auVar45._12_4_ = uVar3;
    auVar31 = vblendps_avx(auVar41,auVar45,8);
    fVar4 = *(float *)(pcVar8 + lVar23);
    fVar5 = *(float *)(pcVar8 + lVar23 + 4);
    fVar6 = *(float *)(pcVar8 + lVar23 + 8);
    auVar54._0_4_ = fVar4 * fVar11 + fVar6 * fVar60 + fVar5 * fVar52;
    auVar54._4_4_ = fVar4 * fVar12 + fVar6 * fVar61 + fVar5 * fVar56;
    auVar54._8_4_ = fVar4 * fVar13 + fVar6 * fVar62 + fVar5 * fVar59;
    auVar54._12_4_ = fVar4 * fVar14 + fVar6 * fVar16 + fVar5 * fVar15;
    uVar3 = *(undefined4 *)(pcVar8 + lVar23 + 0xc);
    auVar57._4_4_ = uVar3;
    auVar57._0_4_ = uVar3;
    auVar57._8_4_ = uVar3;
    auVar57._12_4_ = uVar3;
    auVar39 = vblendps_avx(auVar54,auVar57,8);
    auVar40 = vminps_avx(auVar31,auVar39);
    auVar43 = vmaxps_avx(auVar31,auVar39);
    auVar31 = vmaxss_avx(auVar57,auVar45);
    auVar31 = ZEXT416((uint)(fVar2 * auVar31._0_4_));
    auVar44 = vshufps_avx(auVar31,auVar31,0);
    auVar48 = vsubps_avx(auVar40,auVar44);
    pcVar8 = pBVar7[lVar25 + -1].super_RawBufferView.ptr_ofs;
    sVar9 = pBVar7[lVar25 + -1].super_RawBufferView.stride;
    lVar27 = sVar9 * uVar19;
    lVar25 = sVar9 * uVar24;
    fVar4 = *(float *)(pcVar8 + lVar27);
    fVar5 = *(float *)(pcVar8 + lVar27 + 4);
    fVar6 = *(float *)(pcVar8 + lVar27 + 8);
    auVar55._0_4_ = fVar4 * fVar11 + fVar6 * fVar60 + fVar5 * fVar52;
    auVar55._4_4_ = fVar4 * fVar12 + fVar6 * fVar61 + fVar5 * fVar56;
    auVar55._8_4_ = fVar4 * fVar13 + fVar6 * fVar62 + fVar5 * fVar59;
    auVar55._12_4_ = fVar4 * fVar14 + fVar6 * fVar16 + fVar5 * fVar15;
    uVar3 = *(undefined4 *)(pcVar8 + lVar27 + 0xc);
    auVar58._4_4_ = uVar3;
    auVar58._0_4_ = uVar3;
    auVar58._8_4_ = uVar3;
    auVar58._12_4_ = uVar3;
    auVar31 = vblendps_avx(auVar55,auVar58,8);
    fVar4 = *(float *)(pcVar8 + lVar25);
    fVar5 = *(float *)(pcVar8 + lVar25 + 4);
    fVar6 = *(float *)(pcVar8 + lVar25 + 8);
    auVar63._0_4_ = fVar4 * fVar11 + fVar6 * fVar60 + fVar5 * fVar52;
    auVar63._4_4_ = fVar4 * fVar12 + fVar6 * fVar61 + fVar5 * fVar56;
    auVar63._8_4_ = fVar4 * fVar13 + fVar6 * fVar62 + fVar5 * fVar59;
    auVar63._12_4_ = fVar4 * fVar14 + fVar6 * fVar16 + fVar5 * fVar15;
    uVar3 = *(undefined4 *)(pcVar8 + lVar25 + 0xc);
    auVar65._4_4_ = uVar3;
    auVar65._0_4_ = uVar3;
    auVar65._8_4_ = uVar3;
    auVar65._12_4_ = uVar3;
    auVar39 = vblendps_avx(auVar63,auVar65,8);
    auVar40 = vminps_avx(auVar31,auVar39);
    auVar31 = vmaxps_avx(auVar31,auVar39);
    auVar39 = vmaxss_avx(auVar65,auVar58);
    auVar39 = ZEXT416((uint)(auVar39._0_4_ * fVar2));
    auVar47 = vshufps_avx(auVar39,auVar39,0);
    auVar72 = vsubps_avx(auVar40,auVar47);
    auVar39 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar35)),ZEXT416(0));
    auVar40 = vshufps_avx(auVar39,auVar39,0);
    auVar39 = ZEXT416((uint)(1.0 - auVar39._0_4_));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    fVar56 = auVar39._0_4_ * local_68 + auVar40._0_4_ * auVar48._0_4_;
    fVar59 = auVar39._4_4_ * fStack_64 + auVar40._4_4_ * auVar48._4_4_;
    fVar60 = auVar39._8_4_ * fStack_60 + auVar40._8_4_ * auVar48._8_4_;
    fVar61 = auVar39._12_4_ * fStack_5c + auVar40._12_4_ * auVar48._12_4_;
    fVar62 = auVar39._0_4_ * fVar64 + auVar40._0_4_ * (auVar44._0_4_ + auVar43._0_4_);
    fVar64 = auVar39._4_4_ * fVar67 + auVar40._4_4_ * (auVar44._4_4_ + auVar43._4_4_);
    fVar67 = auVar39._8_4_ * fVar68 + auVar40._8_4_ * (auVar44._8_4_ + auVar43._8_4_);
    fVar68 = auVar39._12_4_ * fVar69 + auVar40._12_4_ * (auVar44._12_4_ + auVar43._12_4_);
    auVar39 = vmaxss_avx(ZEXT416((uint)(fVar36 - fVar34)),ZEXT816(0) << 0x20);
    auVar43 = vshufps_avx(auVar39,auVar39,0);
    auVar39 = ZEXT416((uint)(1.0 - auVar39._0_4_));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    fVar33 = auVar72._0_4_ * auVar43._0_4_ + auVar39._0_4_ * fVar71;
    fVar34 = auVar72._4_4_ * auVar43._4_4_ + auVar39._4_4_ * fVar73;
    fVar35 = auVar72._8_4_ * auVar43._8_4_ + auVar39._8_4_ * fVar74;
    fVar36 = auVar72._12_4_ * auVar43._12_4_ + auVar39._12_4_ * fVar75;
    fVar46 = auVar39._0_4_ * fVar46 + (auVar31._0_4_ + auVar47._0_4_) * auVar43._0_4_;
    fVar49 = auVar39._4_4_ * fVar49 + (auVar31._4_4_ + auVar47._4_4_) * auVar43._4_4_;
    fVar50 = auVar39._8_4_ * fVar50 + (auVar31._8_4_ + auVar47._8_4_) * auVar43._8_4_;
    fVar52 = auVar39._12_4_ * fVar51 + (auVar31._12_4_ + auVar47._12_4_) * auVar43._12_4_;
    uVar22 = iVar21 + 1;
    if ((int)uVar22 < (int)uVar10) {
      psVar20 = &pBVar7[uVar22].super_RawBufferView.stride;
      local_58 = aVar18.x;
      fStack_54 = aVar18.y;
      fStack_50 = aVar18.z;
      do {
        pcVar8 = ((RawBufferView *)(psVar20 + -2))->ptr_ofs;
        lVar27 = *psVar20 * uVar19;
        auVar66._0_4_ = ((float)(int)uVar22 / fVar1 - fVar30) / (fVar53 - fVar30);
        auVar66._4_12_ = SUB6012((undefined1  [60])0x0,0);
        lVar25 = *psVar20 * uVar24;
        fVar51 = *(float *)(pcVar8 + lVar27);
        fVar69 = *(float *)(pcVar8 + lVar27 + 4);
        fVar71 = *(float *)(pcVar8 + lVar27 + 8);
        local_68 = aVar17.x;
        fStack_64 = aVar17.y;
        fStack_60 = aVar17.z;
        auVar40 = vshufps_avx(auVar66,auVar66,0);
        auVar70._0_4_ = fVar51 * fVar11 + fVar71 * local_68 + fVar69 * local_58;
        auVar70._4_4_ = fVar51 * fVar12 + fVar71 * fStack_64 + fVar69 * fStack_54;
        auVar70._8_4_ = fVar51 * fVar13 + fVar71 * fStack_60 + fVar69 * fStack_50;
        auVar70._12_4_ = fVar51 * fVar14 + fVar71 * fVar16 + fVar69 * fVar15;
        uVar3 = *(undefined4 *)(pcVar8 + lVar27 + 0xc);
        auVar76._4_4_ = uVar3;
        auVar76._0_4_ = uVar3;
        auVar76._8_4_ = uVar3;
        auVar76._12_4_ = uVar3;
        auVar31 = vblendps_avx(auVar70,auVar76,8);
        fVar51 = *(float *)(pcVar8 + lVar25 + 4);
        auVar44 = vshufps_avx(ZEXT416((uint)(1.0 - auVar66._0_4_)),
                              ZEXT416((uint)(1.0 - auVar66._0_4_)),0);
        fVar69 = *(float *)(pcVar8 + lVar25 + 8);
        fVar71 = *(float *)(pcVar8 + lVar25);
        auVar42._0_4_ = auVar40._0_4_ * fVar33 + fVar56 * auVar44._0_4_;
        auVar42._4_4_ = auVar40._4_4_ * fVar34 + fVar59 * auVar44._4_4_;
        auVar42._8_4_ = auVar40._8_4_ * fVar35 + fVar60 * auVar44._8_4_;
        auVar42._12_4_ = auVar40._12_4_ * fVar36 + fVar61 * auVar44._12_4_;
        auVar28._0_4_ = fVar11 * fVar71 + local_68 * fVar69 + local_58 * fVar51;
        auVar28._4_4_ = fVar12 * fVar71 + fStack_64 * fVar69 + fStack_54 * fVar51;
        auVar28._8_4_ = fVar13 * fVar71 + fStack_60 * fVar69 + fStack_50 * fVar51;
        auVar28._12_4_ = fVar14 * fVar71 + fVar16 * fVar69 + fVar15 * fVar51;
        uVar3 = *(undefined4 *)(pcVar8 + lVar25 + 0xc);
        auVar38._4_4_ = uVar3;
        auVar38._0_4_ = uVar3;
        auVar38._8_4_ = uVar3;
        auVar38._12_4_ = uVar3;
        auVar39 = vblendps_avx(auVar28,auVar38,8);
        auVar43 = vminps_avx(auVar31,auVar39);
        auVar31 = vmaxps_avx(auVar31,auVar39);
        auVar32._0_4_ = fVar46 * auVar40._0_4_ + fVar62 * auVar44._0_4_;
        auVar32._4_4_ = fVar49 * auVar40._4_4_ + fVar64 * auVar44._4_4_;
        auVar32._8_4_ = fVar50 * auVar40._8_4_ + fVar67 * auVar44._8_4_;
        auVar32._12_4_ = fVar52 * auVar40._12_4_ + fVar68 * auVar44._12_4_;
        auVar39 = vmaxss_avx(auVar38,auVar76);
        auVar39 = ZEXT416((uint)(auVar39._0_4_ * fVar2));
        auVar39 = vshufps_avx(auVar39,auVar39,0);
        auVar43 = vsubps_avx(auVar43,auVar39);
        auVar43 = vsubps_avx(auVar43,auVar42);
        auVar29._0_4_ = auVar31._0_4_ + auVar39._0_4_;
        auVar29._4_4_ = auVar31._4_4_ + auVar39._4_4_;
        auVar29._8_4_ = auVar31._8_4_ + auVar39._8_4_;
        auVar29._12_4_ = auVar31._12_4_ + auVar39._12_4_;
        auVar39 = vsubps_avx(auVar29,auVar32);
        auVar31 = vminps_avx(auVar43,ZEXT816(0));
        fVar56 = fVar56 + auVar31._0_4_;
        fVar59 = fVar59 + auVar31._4_4_;
        fVar60 = fVar60 + auVar31._8_4_;
        fVar61 = fVar61 + auVar31._12_4_;
        fVar33 = fVar33 + auVar31._0_4_;
        fVar34 = fVar34 + auVar31._4_4_;
        fVar35 = fVar35 + auVar31._8_4_;
        fVar36 = fVar36 + auVar31._12_4_;
        auVar31 = vmaxps_avx(auVar39,ZEXT816(0));
        fVar62 = fVar62 + auVar31._0_4_;
        fVar64 = fVar64 + auVar31._4_4_;
        fVar67 = fVar67 + auVar31._8_4_;
        fVar68 = fVar68 + auVar31._12_4_;
        fVar46 = fVar46 + auVar31._0_4_;
        fVar49 = fVar49 + auVar31._4_4_;
        fVar50 = fVar50 + auVar31._8_4_;
        fVar52 = fVar52 + auVar31._12_4_;
        uVar22 = uVar22 + 1;
        psVar20 = psVar20 + 7;
      } while (uVar10 != uVar22);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar56;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar59;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar60;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar61;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar62;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar64;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar67;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar68;
  }
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar33;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar34;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar35;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar36;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar46;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar49;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar50;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar52;
  return __return_storage_ptr__;
}

Assistant:

__forceinline LBBox3fa linearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& dt) const {
      return LBBox3fa([&] (size_t itime) { return bounds(space, primID, itime); }, dt, time_range, fnumTimeSegments);
    }